

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperloglog.cpp
# Opt level: O1

void duckdb_hll::hllSparseRegHisto(uint8_t *sparse,int sparselen,int *invalid,int *reghisto)

{
  int *piVar1;
  byte bVar2;
  byte *pbVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  bool bVar7;
  
  if (sparselen < 1) {
    bVar7 = true;
  }
  else {
    pbVar3 = sparse + sparselen;
    iVar4 = 0;
    do {
      bVar2 = *sparse;
      if ((bVar2 & 0xffffffc0) == 0x40) {
        iVar6 = (uint)sparse[1] + (bVar2 & 0x3f) * 0x100 + 1;
        *reghisto = *reghisto + iVar6;
        lVar5 = 2;
      }
      else {
        if ((bVar2 & 0xc0) == 0) {
          iVar6 = bVar2 + 1;
          *reghisto = *reghisto + iVar6;
        }
        else {
          iVar6 = (bVar2 & 3) + 1;
          piVar1 = (int *)((long)reghisto + (ulong)(bVar2 & 0x7c) + 4);
          *piVar1 = *piVar1 + iVar6;
        }
        lVar5 = 1;
      }
      iVar4 = iVar4 + iVar6;
      sparse = sparse + lVar5;
    } while (sparse < pbVar3);
    bVar7 = iVar4 != 0x1000;
  }
  if ((invalid != (int *)0x0) && (bVar7)) {
    *invalid = 1;
  }
  return;
}

Assistant:

void hllSparseRegHisto(uint8_t *sparse, int sparselen, int *invalid, int* reghisto) {
    int idx = 0, runlen, regval;
    uint8_t *end = sparse+sparselen, *p = sparse;

    while(p < end) {
        if (HLL_SPARSE_IS_ZERO(p)) {
            runlen = HLL_SPARSE_ZERO_LEN(p);
            idx += runlen;
            reghisto[0] += runlen;
            p++;
        } else if (HLL_SPARSE_IS_XZERO(p)) {
            runlen = HLL_SPARSE_XZERO_LEN(p);
            idx += runlen;
            reghisto[0] += runlen;
            p += 2;
        } else {
            runlen = HLL_SPARSE_VAL_LEN(p);
            regval = HLL_SPARSE_VAL_VALUE(p);
            idx += runlen;
            reghisto[regval] += runlen;
            p++;
        }
    }
    if (idx != HLL_REGISTERS && invalid) *invalid = 1;
}